

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEAngle.cpp
# Opt level: O2

void __thiscall
CEAngle::SetAngle_DmsVect(CEAngle *this,vector<double,_std::allocator<double>_> *angle)

{
  double dVar1;
  double dVar3;
  int iVar4;
  const_reference pvVar5;
  size_type sVar6;
  invalid_value *piVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_b8;
  double local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  double ang;
  string msg;
  double dVar2;
  
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](angle,0);
  dVar1 = *pvVar5;
  dVar2 = *pvVar5;
  ang = 0.0;
  sVar6 = std::vector<double,_std::allocator<double>_>::size(angle);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](angle,2);
  local_98 = *pvVar5;
  if (sVar6 == 4) {
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](angle,3);
    local_98 = local_98 + *pvVar5;
  }
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](angle,0);
  dVar3 = *pvVar5;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](angle,1);
  iVar4 = iauAf2a(local_98,(dVar2 <= 0.0 && dVar1 != 0.0) * '\x02' + '+',(int)dVar3,(int)*pvVar5,
                  &ang);
  if (iVar4 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&msg,"[ERROR] ",(allocator *)&bStack_b8);
    __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&bStack_b8);
    if (iVar4 == 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](angle,0);
      std::__cxx11::to_string(&local_70,*pvVar5);
      std::operator+(&local_90,"Degree value \'",&local_70);
      std::operator+(&bStack_b8,&local_90,"\' not in range 0-359");
      std::__cxx11::string::operator+=((string *)&msg,(string *)&bStack_b8);
      std::__cxx11::string::~string((string *)&bStack_b8);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
      piVar7 = (invalid_value *)__cxa_allocate_exception(0xa8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&bStack_b8,"CEAngle::SetAngle_DmsVect",(allocator *)&local_90);
      CEException::invalid_value::invalid_value(piVar7,&bStack_b8,&msg);
      __cxa_throw(piVar7,&CEException::invalid_value::typeinfo,
                  CEExceptionHandler::~CEExceptionHandler);
    }
    if (iVar4 == 2) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](angle,1);
      std::__cxx11::to_string(&local_70,*pvVar5);
      std::operator+(&local_90,"Arcmin value \'",&local_70);
      std::operator+(&bStack_b8,&local_90,"\' not in range 0-59");
      std::__cxx11::string::operator+=((string *)&msg,(string *)&bStack_b8);
      std::__cxx11::string::~string((string *)&bStack_b8);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
      piVar7 = (invalid_value *)__cxa_allocate_exception(0xa8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&bStack_b8,"CEAngle::SetAngle_DmsVect",(allocator *)&local_90);
      CEException::invalid_value::invalid_value(piVar7,&bStack_b8,&msg);
      __cxa_throw(piVar7,&CEException::invalid_value::typeinfo,
                  CEExceptionHandler::~CEExceptionHandler);
    }
    if (iVar4 == 3) {
      std::__cxx11::to_string(&local_70,local_98);
      std::operator+(&local_90,"Arcsec value \'",&local_70);
      std::operator+(&bStack_b8,&local_90,"\' not in range 0-59.999...");
      std::__cxx11::string::operator+=((string *)&msg,(string *)&bStack_b8);
      std::__cxx11::string::~string((string *)&bStack_b8);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
      piVar7 = (invalid_value *)__cxa_allocate_exception(0xa8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&bStack_b8,"CEAngle::SetAngle_DmsVect",(allocator *)&local_90);
      CEException::invalid_value::invalid_value(piVar7,&bStack_b8,&msg);
      __cxa_throw(piVar7,&CEException::invalid_value::typeinfo,
                  CEExceptionHandler::~CEExceptionHandler);
    }
    std::__cxx11::string::~string((string *)&msg);
  }
  msg._M_dataplus._M_p._0_4_ = 1;
  SetAngle(this,&ang,(CEAngleType *)&msg);
  return;
}

Assistant:

void CEAngle::SetAngle_DmsVect(const std::vector<double>& angle)
{
    // Get the angle's sign
    char sign = (angle[0] < 0.0) ? '-' : '+';

    // Convert the values to an angle in degrees
    double ang(0.0);
    double sec = (angle.size() == 4) ? angle[2]+angle[3] : angle[2];

    // Pass the values to the appropriate SOFA algorithm
    int err = iauAf2a(sign, int(angle[0]), int(angle[1]), sec, &ang);

    // Handle the error
    if (err) {
        std::string msg = "[ERROR] ";
        switch(err) {
            // Hours out of bounds
            case 1:
                msg += "Degree value \'" + std::to_string(angle[0]) + "\' not in range 0-359";
                throw CEException::invalid_value("CEAngle::SetAngle_DmsVect", msg);
            // Minutes out of bounds
            case 2:
                msg += "Arcmin value \'" + std::to_string(angle[1]) + "\' not in range 0-59";
                throw CEException::invalid_value("CEAngle::SetAngle_DmsVect", msg);
            // Seconds out of bounds
            case 3:
                msg += "Arcsec value \'" + std::to_string(sec) + "\' not in range 0-59.999...";
                throw CEException::invalid_value("CEAngle::SetAngle_DmsVect", msg);
        }
    }

    // Set the angle
    SetAngle(ang, CEAngleType::RADIANS);
    return;
}